

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

bool __thiscall Map::Occupied(Map *this,uchar x,uchar y,OccupiedTarget target,bool adminghost)

{
  _List_node_base *p_Var1;
  NPC *pNVar2;
  pointer ppNVar3;
  byte bVar4;
  _List_node_base *p_Var5;
  bool bVar6;
  
  if (this->width <= x) {
    return false;
  }
  if (this->height <= y) {
    return false;
  }
  if (target != NPCOnly) {
    for (p_Var5 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next;
        bVar6 = p_Var5 != (_List_node_base *)&this->characters, bVar6; p_Var5 = p_Var5->_M_next) {
      p_Var1 = p_Var5[1]._M_next;
      if (adminghost) {
        bVar4 = 1;
        if ((*(byte *)((long)(p_Var1 + 0xf) + 4) & 4) == 0) {
          bVar4 = (*(byte *)&p_Var1[0xf]._M_next & 4) >> 2;
        }
      }
      else {
        bVar4 = 0;
      }
      if ((*(uchar *)&p_Var1[0xc]._M_next == x) &&
         ((~bVar4 & *(uchar *)((long)(p_Var1 + 0xc) + 1) == y) != 0)) {
        if (bVar6) {
          return true;
        }
        break;
      }
    }
    if (target == PlayerOnly) {
      return false;
    }
  }
  ppNVar3 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    bVar6 = ppNVar3 ==
            (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar6) {
      return false;
    }
    pNVar2 = *ppNVar3;
    if (((pNVar2->alive == true) && (pNVar2->x == x)) && (pNVar2->y == y)) break;
    ppNVar3 = ppNVar3 + 1;
  }
  if (bVar6) {
    return false;
  }
  return true;
}

Assistant:

bool Map::Occupied(unsigned char x, unsigned char y, Map::OccupiedTarget target, bool adminghost) const
{
	if (!InBounds(x, y))
	{
		return false;
	}

	if (target != Map::NPCOnly)
	{
		UTIL_FOREACH(this->characters, character)
		{
			bool ghost = adminghost && (!character->CanInteractCombat() || character->IsHideNpc());

			if (character->x == x && character->y == y && !ghost)
			{
				return true;
			}
		}
	}

	if (target != Map::PlayerOnly)
	{
		UTIL_FOREACH(this->npcs, npc)
		{
			if (npc->alive && npc->x == x && npc->y == y)
			{
				return true;
			}
		}
	}

	return false;
}